

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphEdit.cpp
# Opt level: O1

void __thiscall GraphEdit::calculateCellHeight(GraphEdit *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  
  lVar3 = QAbstractScrollArea::viewport();
  iVar4 = this->mMaxValue + 1;
  iVar5 = iVar4 - this->mMinValue;
  iVar2 = -iVar5;
  if (0 < iVar5) {
    iVar2 = iVar5;
  }
  if (iVar4 != this->mMinValue) {
    iVar5 = *(int *)(*(long *)(lVar3 + 0x20) + 0x20) - *(int *)(*(long *)(lVar3 + 0x20) + 0x18);
    uVar6 = iVar5 - 0xf;
    iVar4 = (int)uVar6 / iVar2;
    if (this->mBarMode == true) {
      iVar2 = QAbstractScrollArea::verticalScrollBar();
      QAbstractSlider::setRange(iVar2,0);
    }
    else if (iVar4 < 8) {
      uVar1 = iVar5 - 8;
      if (-1 < (int)uVar6) {
        uVar1 = uVar6;
      }
      iVar2 = QAbstractScrollArea::verticalScrollBar();
      QAbstractSlider::value();
      QAbstractSlider::pageStep();
      QAbstractSlider::setPageStep(iVar2);
      QAbstractSlider::setRange(iVar2,this->mMinValue);
      QAbstractSlider::setValue(iVar2);
      uVar6 = uVar1 & 0xfffffff8;
      iVar4 = 8;
    }
    else {
      iVar5 = QAbstractScrollArea::verticalScrollBar();
      QAbstractSlider::setRange(iVar5,0);
      uVar6 = iVar4 * iVar2;
    }
    lVar3 = QAbstractScrollArea::viewport();
    iVar2 = *(int *)(*(long *)(lVar3 + 0x20) + 0x20);
    iVar5 = *(int *)(*(long *)(lVar3 + 0x20) + 0x18) + uVar6;
    iVar2 = ((iVar2 - iVar5) - ((iVar2 - iVar5) + 1 >> 0x1f)) + 1 >> 1;
    (this->mPlotRect).y1 = iVar2;
    (this->mPlotRect).y2 = iVar2 + uVar6 + -1;
    this->mCellHeight = iVar4 + (uint)(iVar4 == 0);
  }
  return;
}

Assistant:

void GraphEdit::calculateCellHeight() {
    auto const _height = availableHeight();

    auto range = abs(mMaxValue + 1 - mMinValue);
    if (range) {
        int newHeight;
        auto cellHeight = _height / range;
        if (mBarMode) {
            verticalScrollBar()->setRange(0, 0);
            newHeight = _height;
        } else {
            if (cellHeight < TU::MIN_CELL_HEIGHT) {
                cellHeight = TU::MIN_CELL_HEIGHT;
                // idk why the -1 is needed but it works
                auto pagestep = (_height / TU::MIN_CELL_HEIGHT) - 1;
                auto scrollbar = verticalScrollBar();

                // keep the current value proportional to the new range
                auto value = scrollbar->value() + (scrollbar->pageStep() + 1) / 2 - (pagestep + 1) / 2;

                scrollbar->setPageStep(pagestep);
                scrollbar->setRange(mMinValue, mMaxValue - pagestep);
                scrollbar->setValue(value);
                newHeight = (pagestep + 1) * TU::MIN_CELL_HEIGHT;
            } else {
                verticalScrollBar()->setRange(0, 0);
                newHeight = cellHeight * range;
            }
        }
        
        mPlotRect.setTop((viewport()->height() - newHeight) / 2);
        mPlotRect.setHeight(newHeight);
        
        if (cellHeight == 0) {
            cellHeight = 1;
        }
        mCellHeight = cellHeight;
    }
}